

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_rgb_to_gray_fixed
               (png_structrp png_ptr,int error_action,png_fixed_point red,png_fixed_point green)

{
  int iVar1;
  png_uint_16 green_int;
  png_uint_16 red_int;
  png_fixed_point green_local;
  png_fixed_point red_local;
  int error_action_local;
  png_structrp png_ptr_local;
  
  iVar1 = png_rtran_ok(png_ptr,1);
  if (iVar1 != 0) {
    if (error_action == 1) {
      png_ptr->transformations = png_ptr->transformations | 0x600000;
    }
    else if (error_action == 2) {
      png_ptr->transformations = png_ptr->transformations | 0x400000;
    }
    else {
      if (error_action != 3) {
        png_error(png_ptr,"invalid error action to rgb_to_gray");
      }
      png_ptr->transformations = png_ptr->transformations | 0x200000;
    }
    if (png_ptr->color_type == '\x03') {
      png_ptr->transformations = png_ptr->transformations | 0x1000;
    }
    if (((red < 0) || (green < 0)) || (100000 < red + green)) {
      if ((-1 < red) && (-1 < green)) {
        png_app_warning(png_ptr,"ignoring out of range rgb_to_gray coefficients");
      }
      if ((png_ptr->rgb_to_gray_red_coeff == 0) && (png_ptr->rgb_to_gray_green_coeff == 0)) {
        png_ptr->rgb_to_gray_red_coeff = 0x1b38;
        png_ptr->rgb_to_gray_green_coeff = 0x5b8a;
      }
    }
    else {
      png_ptr->rgb_to_gray_red_coeff = (png_uint_16)((ulong)(uint)(red << 0xf) / 100000);
      png_ptr->rgb_to_gray_green_coeff = (png_uint_16)((ulong)(uint)(green << 0xf) / 100000);
      png_ptr->rgb_to_gray_coefficients_set = '\x01';
    }
  }
  return;
}

Assistant:

void PNGFAPI
png_set_rgb_to_gray_fixed(png_structrp png_ptr, int error_action,
    png_fixed_point red, png_fixed_point green)
{
   png_debug(1, "in png_set_rgb_to_gray");

   /* Need the IHDR here because of the check on color_type below. */
   /* TODO: fix this */
   if (png_rtran_ok(png_ptr, 1) == 0)
      return;

   switch (error_action)
   {
      case PNG_ERROR_ACTION_NONE:
         png_ptr->transformations |= PNG_RGB_TO_GRAY;
         break;

      case PNG_ERROR_ACTION_WARN:
         png_ptr->transformations |= PNG_RGB_TO_GRAY_WARN;
         break;

      case PNG_ERROR_ACTION_ERROR:
         png_ptr->transformations |= PNG_RGB_TO_GRAY_ERR;
         break;

      default:
         png_error(png_ptr, "invalid error action to rgb_to_gray");
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
#ifdef PNG_READ_EXPAND_SUPPORTED
      png_ptr->transformations |= PNG_EXPAND;
#else
   {
      /* Make this an error in 1.6 because otherwise the application may assume
       * that it just worked and get a memory overwrite.
       */
      png_error(png_ptr,
          "Cannot do RGB_TO_GRAY without EXPAND_SUPPORTED");

      /* png_ptr->transformations &= ~PNG_RGB_TO_GRAY; */
   }
#endif
   {
      if (red >= 0 && green >= 0 && red + green <= PNG_FP_1)
      {
         png_uint_16 red_int, green_int;

         /* NOTE: this calculation does not round, but this behavior is retained
          * for consistency; the inaccuracy is very small.  The code here always
          * overwrites the coefficients, regardless of whether they have been
          * defaulted or set already.
          */
         red_int = (png_uint_16)(((png_uint_32)red*32768)/100000);
         green_int = (png_uint_16)(((png_uint_32)green*32768)/100000);

         png_ptr->rgb_to_gray_red_coeff   = red_int;
         png_ptr->rgb_to_gray_green_coeff = green_int;
         png_ptr->rgb_to_gray_coefficients_set = 1;
      }

      else
      {
         if (red >= 0 && green >= 0)
            png_app_warning(png_ptr,
                "ignoring out of range rgb_to_gray coefficients");

         /* Use the defaults, from the cHRM chunk if set, else the historical
          * values which are close to the sRGB/HDTV/ITU-Rec 709 values.  See
          * png_do_rgb_to_gray for more discussion of the values.  In this case
          * the coefficients are not marked as 'set' and are not overwritten if
          * something has already provided a default.
          */
         if (png_ptr->rgb_to_gray_red_coeff == 0 &&
             png_ptr->rgb_to_gray_green_coeff == 0)
         {
            png_ptr->rgb_to_gray_red_coeff   = 6968;
            png_ptr->rgb_to_gray_green_coeff = 23434;
            /* png_ptr->rgb_to_gray_blue_coeff  = 2366; */
         }
      }
   }
}